

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O1

void __thiscall QGraphicsScale::applyTo(QGraphicsScale *this,QMatrix4x4 *matrix)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  QMatrix4x4::translate((QVector3D *)matrix);
  QMatrix4x4::scale((float)*(double *)(lVar2 + 0x90),(float)*(double *)(lVar2 + 0x98),
                    (float)*(double *)(lVar2 + 0xa0));
  QMatrix4x4::translate((QVector3D *)matrix);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScale::applyTo(QMatrix4x4 *matrix) const
{
    Q_D(const QGraphicsScale);
    matrix->translate(d->origin);
    matrix->scale(d->xScale, d->yScale, d->zScale);
    matrix->translate(-d->origin);
}